

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O1

target_ulong_conflict
helper_subq_s_w_mips(target_ulong_conflict rs,target_ulong_conflict rt,CPUMIPSState_conflict *env)

{
  byte *pbVar1;
  DSP32Value dt;
  DSP32Value ds;
  
  if (-1 < (int)((rs - rt ^ rs) & (rt ^ rs))) {
    return rs - rt;
  }
  pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
  *pbVar1 = *pbVar1 | 0x10;
  return 0x7fffffff - ((int)rs >> 0x1f);
}

Assistant:

static inline uint32_t mipsdsp_sat32_sub(int32_t a, int32_t b,
                                         CPUMIPSState *env)
{
    int32_t  temp;

    temp = a - b;
    if (MIPSDSP_OVERFLOW_SUB(a, b, temp, 0x80000000)) {
        if (a >= 0) {
            temp = 0x7FFFFFFF;
        } else {
            temp = 0x80000000;
        }
        set_DSPControl_overflow_flag(1, 20, env);
    }

    return temp & 0xFFFFFFFFull;
}